

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.h
# Opt level: O2

int32_t __thiscall CVmObjStringBuffer::utf8_length(CVmObjStringBuffer *this)

{
  int *piVar1;
  int iVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  
  piVar1 = (int *)(this->super_CVmObject).ext_;
  puVar3 = (uint *)(piVar1 + 3);
  iVar2 = 0;
  for (iVar4 = *piVar1; 0 < iVar4; iVar4 = iVar4 + -1) {
    iVar5 = 3 - (uint)(*puVar3 < 0x800);
    if ((int)*puVar3 < 0x80) {
      iVar5 = 1;
    }
    iVar2 = iVar2 + iVar5;
    puVar3 = puVar3 + 1;
  }
  return iVar2;
}

Assistant:

vm_strbuf_ext *get_ext() const { return (vm_strbuf_ext *)ext_; }